

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile(void)

{
  bool bVar1;
  undefined1 uVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar5;
  String *in_RDI;
  String SVar6;
  undefined7 in_stack_fffffffffffffef0;
  String local_d8;
  FilePath local_c8;
  undefined1 local_b8 [8];
  FilePath result;
  FilePath local_a0;
  FilePath local_90;
  FilePath local_80;
  undefined1 local_70 [8];
  FilePath output_name;
  FilePath local_50;
  FilePath local_40;
  FilePath local_30;
  char *local_20;
  char *colon;
  char *gtest_output_flag;
  
  colon = String::c_str((String *)FLAGS_gtest_output);
  if (colon == (char *)0x0) {
    String::String(in_RDI,"");
    sVar5 = extraout_RDX;
  }
  else {
    local_20 = strchr(colon,0x3a);
    if (local_20 == (char *)0x0) {
      pUVar3 = UnitTest::GetInstance();
      pcVar4 = UnitTest::original_working_dir(pUVar3);
      FilePath::FilePath(&local_40,pcVar4);
      FilePath::FilePath(&local_50,"test_detail.xml");
      FilePath::ConcatPaths(&local_30,&local_40,&local_50);
      FilePath::ToString((FilePath *)in_RDI);
      FilePath::~FilePath(&local_30);
      FilePath::~FilePath(&local_50);
      FilePath::~FilePath(&local_40);
      sVar5 = extraout_RDX_00;
    }
    else {
      FilePath::FilePath((FilePath *)local_70,local_20 + 1);
      bVar1 = FilePath::IsAbsolutePath((FilePath *)local_70);
      if (!bVar1) {
        pUVar3 = UnitTest::GetInstance();
        pcVar4 = UnitTest::original_working_dir(pUVar3);
        FilePath::FilePath(&local_90,pcVar4);
        FilePath::FilePath(&local_a0,local_20 + 1);
        FilePath::ConcatPaths(&local_80,&local_90,&local_a0);
        FilePath::operator=((FilePath *)local_70,&local_80);
        FilePath::~FilePath(&local_80);
        FilePath::~FilePath(&local_a0);
        FilePath::~FilePath(&local_90);
      }
      uVar2 = FilePath::IsDirectory((FilePath *)local_70);
      if ((bool)uVar2) {
        GetCurrentExecutableName();
        GetOutputFormat();
        pcVar4 = String::c_str(&local_d8);
        FilePath::GenerateUniqueFileName((FilePath *)local_b8,(FilePath *)local_70,&local_c8,pcVar4)
        ;
        String::~String((String *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
        FilePath::~FilePath(&local_c8);
        FilePath::ToString((FilePath *)in_RDI);
        result.pathname_.length_._4_4_ = 1;
        FilePath::~FilePath((FilePath *)local_b8);
      }
      else {
        FilePath::ToString((FilePath *)in_RDI);
        result.pathname_.length_._4_4_ = 1;
      }
      FilePath::~FilePath((FilePath *)local_70);
      sVar5 = extraout_RDX_01;
    }
  }
  SVar6.length_ = sVar5;
  SVar6.c_str_ = (char *)in_RDI;
  return SVar6;
}

Assistant:

String UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return String("");

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return String(internal::FilePath::ConcatPaths(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile)).ToString() );

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.ToString();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.ToString();
}